

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

void __thiscall
io::net::dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_>::consume
          (dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *this,size_t n
          )

{
  ulong uVar1;
  unsigned_long *puVar2;
  size_t m;
  size_t n_local;
  dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *this_local;
  
  m = n;
  n_local = (size_t)this;
  puVar2 = std::min<unsigned_long>(&m,&this->size_);
  uVar1 = *puVar2;
  std::__cxx11::string::erase((ulong)this->str_,uVar1);
  this->size_ = this->size_ - uVar1;
  return;
}

Assistant:

void consume(std::size_t n)
    {
        std::size_t m = std::min(n, size_);
        str_.erase(m);
        size_ -= m;
    }